

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O1

int comex_unlock(int mutex,int proc)

{
  char *message;
  
  message = (char *)_my_malloc(0x28);
  message[0] = '\x13';
  message[1] = '\0';
  message[2] = '\0';
  message[3] = '\0';
  message[8] = '\0';
  message[9] = '\0';
  message[10] = '\0';
  message[0xb] = '\0';
  message[0xc] = '\0';
  message[0xd] = '\0';
  message[0xe] = '\0';
  message[0xf] = '\0';
  message[0x10] = '\0';
  message[0x11] = '\0';
  message[0x12] = '\0';
  message[0x13] = '\0';
  message[0x14] = '\0';
  message[0x15] = '\0';
  message[0x16] = '\0';
  message[0x17] = '\0';
  *(int *)(message + 0x18) = mutex;
  message[0x20] = '\0';
  message[0x21] = '\0';
  message[0x22] = '\0';
  message[0x23] = '\0';
  message[0x24] = '\0';
  message[0x25] = '\0';
  message[0x26] = '\0';
  message[0x27] = '\0';
  _mq_push(proc,message,0x28);
  if (7 < l_state.mq_size) {
    comex_make_progress();
  }
  return 0;
}

Assistant:

int comex_unlock(int mutex, int proc)
{
#if DEBUG
    printf("[%d] comex_unlock id=%d proc=%d\n", l_state.rank, mutex, proc);
#endif

    header_t *header = NULL;
    header = _my_malloc(sizeof(header_t));
    header->operation = OP_UNLOCK;
    header->remote_address = NULL;
    header->local_address = NULL;
    header->length = mutex;
    header->notify_address = NULL;

    _mq_push(proc, (char*)header, sizeof(header_t));
    _make_progress_if_needed();

    return COMEX_SUCCESS;
}